

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_invalid_opc.cpp
# Opt level: O0

void __thiscall
spvtools::opt::ReplaceInvalidOpcodePass::ReplaceInstruction
          (ReplaceInvalidOpcodePass *this,Instruction *inst,char *source,uint32_t line_number,
          uint32_t column_number)

{
  bool bVar1;
  uint32_t uVar2;
  Op opcode;
  IRContext *pIVar3;
  MessageConsumer *pMVar4;
  char *__args_3;
  spv_position_t local_68;
  undefined1 local_50 [8];
  string message;
  uint32_t const_id;
  uint32_t column_number_local;
  uint32_t line_number_local;
  char *source_local;
  Instruction *inst_local;
  ReplaceInvalidOpcodePass *this_local;
  
  uVar2 = Instruction::result_id(inst);
  if (uVar2 != 0) {
    uVar2 = Instruction::type_id(inst);
    message.field_2._12_4_ = GetSpecialConstant(this,uVar2);
    pIVar3 = Pass::context(&this->super_Pass);
    IRContext::KillNamesAndDecorates(pIVar3,inst);
    pIVar3 = Pass::context(&this->super_Pass);
    uVar2 = Instruction::result_id(inst);
    IRContext::ReplaceAllUsesWith(pIVar3,uVar2,message.field_2._12_4_);
  }
  bVar1 = Instruction::IsBlockTerminator(inst);
  if (!bVar1) {
    pMVar4 = Pass::consumer(&this->super_Pass);
    bVar1 = std::function::operator_cast_to_bool((function *)pMVar4);
    if (bVar1) {
      opcode = Instruction::opcode(inst);
      BuildWarningMessage_abi_cxx11_((string *)local_50,this,opcode);
      pMVar4 = Pass::consumer(&this->super_Pass);
      local_68.line = (size_t)line_number;
      local_68.column = (size_t)column_number;
      local_68.index = 0;
      __args_3 = (char *)std::__cxx11::string::c_str();
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(pMVar4,SPV_MSG_WARNING,source,&local_68,__args_3);
      std::__cxx11::string::~string((string *)local_50);
    }
    pIVar3 = Pass::context(&this->super_Pass);
    IRContext::KillInst(pIVar3,inst);
    return;
  }
  __assert_fail("!inst->IsBlockTerminator() && \"We cannot simply delete a block terminator.  It must be replaced \" \"with something.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/replace_invalid_opc.cpp"
                ,0xac,
                "void spvtools::opt::ReplaceInvalidOpcodePass::ReplaceInstruction(Instruction *, const char *, uint32_t, uint32_t)"
               );
}

Assistant:

void ReplaceInvalidOpcodePass::ReplaceInstruction(Instruction* inst,
                                                  const char* source,
                                                  uint32_t line_number,
                                                  uint32_t column_number) {
  if (inst->result_id() != 0) {
    uint32_t const_id = GetSpecialConstant(inst->type_id());
    context()->KillNamesAndDecorates(inst);
    context()->ReplaceAllUsesWith(inst->result_id(), const_id);
  }
  assert(!inst->IsBlockTerminator() &&
         "We cannot simply delete a block terminator.  It must be replaced "
         "with something.");
  if (consumer()) {
    std::string message = BuildWarningMessage(inst->opcode());
    consumer()(SPV_MSG_WARNING, source, {line_number, column_number, 0},
               message.c_str());
  }
  context()->KillInst(inst);
}